

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  char *in_RSI;
  ImVector<ImGuiWindow_*> *in_RDI;
  int i;
  void *unaff_retaddr;
  char *in_stack_00000070;
  ImGuiWindow *in_stack_00000078;
  int local_14;
  
  bVar1 = TreeNode(in_RSI,"%s (%d)",in_RSI,(ulong)(uint)in_RDI->Size);
  if (bVar1) {
    local_14 = in_RDI->Size;
    while (local_14 = local_14 + -1, -1 < local_14) {
      ImVector<ImGuiWindow_*>::operator[](in_RDI,local_14);
      PushID(unaff_retaddr);
      ImVector<ImGuiWindow_*>::operator[](in_RDI,local_14);
      DebugNodeWindow(in_stack_00000078,in_stack_00000070);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow*>* windows, const char* label)
{
    if (!TreeNode(label, "%s (%d)", label, windows->Size))
        return;
    for (int i = windows->Size - 1; i >= 0; i--) // Iterate front to back
    {
        PushID((*windows)[i]);
        DebugNodeWindow((*windows)[i], "Window");
        PopID();
    }
    TreePop();
}